

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

ostream * Imath_3_2::operator<<(ostream *s,Matrix22<float> *m)

{
  fmtflags __fmtfl;
  fmtflags fVar1;
  _Ios_Fmtflags _Var2;
  _Setw _Var3;
  streamsize sVar4;
  ostream *poVar5;
  float *pfVar6;
  Matrix22<float> *in_RSI;
  ostream *in_RDI;
  int width;
  fmtflags oldFlags;
  undefined8 in_stack_ffffffffffffff98;
  ios_base *in_stack_ffffffffffffffa0;
  int local_18;
  
  __fmtfl = std::ios_base::flags((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  fVar1 = std::ios_base::flags((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  _Var2 = std::operator&(fVar1,_S_fixed);
  fVar1 = (fmtflags)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (_Var2 == ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
    std::ios_base::setf(in_stack_ffffffffffffffa0,fVar1);
    std::ios_base::setf(in_stack_ffffffffffffffa0,fVar1);
    sVar4 = std::ios_base::precision((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
    local_18 = (int)sVar4 + 8;
  }
  else {
    std::ios_base::setf(in_stack_ffffffffffffffa0,fVar1);
    sVar4 = std::ios_base::precision((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
    local_18 = (int)sVar4 + 5;
  }
  poVar5 = std::operator<<(in_RDI,"(");
  _Var3 = std::setw(local_18);
  poVar5 = std::operator<<(poVar5,_Var3);
  pfVar6 = Matrix22<float>::operator[](in_RSI,0);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pfVar6);
  poVar5 = std::operator<<(poVar5," ");
  _Var3 = std::setw(local_18);
  poVar5 = std::operator<<(poVar5,_Var3);
  pfVar6 = Matrix22<float>::operator[](in_RSI,0);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar6[1]);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5," ");
  _Var3 = std::setw(local_18);
  poVar5 = std::operator<<(poVar5,_Var3);
  pfVar6 = Matrix22<float>::operator[](in_RSI,1);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pfVar6);
  poVar5 = std::operator<<(poVar5," ");
  _Var3 = std::setw(local_18);
  poVar5 = std::operator<<(poVar5,_Var3);
  pfVar6 = Matrix22<float>::operator[](in_RSI,1);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,pfVar6[1]);
  std::operator<<(poVar5,")\n");
  std::ios_base::flags((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return in_RDI;
}

Assistant:

std::ostream&
operator<< (std::ostream& s, const Matrix22<T>& m)
{
    std::ios_base::fmtflags oldFlags = s.flags ();
    int                     width;

    if (s.flags () & std::ios_base::fixed)
    {
        s.setf (std::ios_base::showpoint);
        width = static_cast<int> (s.precision ()) + 5;
    }
    else
    {
        s.setf (std::ios_base::scientific);
        s.setf (std::ios_base::showpoint);
        width = static_cast<int> (s.precision ()) + 8;
    }

    s << "(" << std::setw (width) << m[0][0] << " " << std::setw (width)
      << m[0][1] << "\n"
      <<

        " " << std::setw (width) << m[1][0] << " " << std::setw (width)
      << m[1][1] << ")\n";

    s.flags (oldFlags);
    return s;
}